

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall TTD::MarkTable::MoveToNextAddress(MarkTable *this)

{
  MarkTableTag MVar1;
  MarkTableTag tag;
  MarkTable *this_local;
  
  this->m_iterPos = this->m_iterPos + 1;
  while ((this->m_iterPos < this->m_capcity &&
         (MVar1 = TTD::operator&(this->m_markArray[this->m_iterPos],AllKindMask), MVar1 == Clear)))
  {
    this->m_iterPos = this->m_iterPos + 1;
  }
  return;
}

Assistant:

void MoveToNextAddress()
        {
            this->m_iterPos++;

            while (this->m_iterPos < this->m_capcity)
            {
                MarkTableTag tag = this->m_markArray[this->m_iterPos];

                if ((tag & MarkTableTag::AllKindMask) != MarkTableTag::Clear)
                {
                    return;
                }

                this->m_iterPos++;
            }
        }